

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_10ddcf::CorruptInternalNodes::iterate(CorruptInternalNodes *this)

{
  anon_class_16_2_f7f469bf fn;
  pointer phVar1;
  test_trie *index;
  CorruptInternalNodes *this_local;
  
  phVar1 = std::
           unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::get(&this->index_);
  fn.index = phVar1;
  fn.this = this;
  check_for_error<(anonymous_namespace)::CorruptInternalNodes::iterate()const::__0>
            (fn,index_corrupt);
  return;
}

Assistant:

void CorruptInternalNodes::iterate () const {
        test_trie const & index = *index_.get ();
        // Using an iterator.
        check_for_error (
            [this, &index] () {
                std::list<test_trie::value_type> visited;
                std::copy (index.begin (db_), index.end (db_),
                           std::inserter (visited, visited.end ()));
            },
            pstore::error_code::index_corrupt);
    }